

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O0

void __thiscall thread::ThreadPool::ThreadPool(ThreadPool *this,int size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  int in_ESI;
  undefined1 *in_RDI;
  ulong uVar5;
  MutexLock *in_stack_ffffffffffffff78;
  Condition *in_stack_ffffffffffffff80;
  ulong *local_50;
  
  *in_RDI = 0;
  *(int *)(in_RDI + 4) = in_ESI;
  uVar2 = (ulong)in_ESI;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x30),0);
  uVar5 = uVar3 + 8;
  if (SUB168(auVar1 * ZEXT816(0x30),8) != 0 || 0xfffffffffffffff7 < uVar3) {
    uVar5 = 0xffffffffffffffff;
  }
  puVar4 = (ulong *)operator_new__(uVar5);
  *puVar4 = uVar2;
  puVar4 = puVar4 + 1;
  if (uVar2 != 0) {
    local_50 = puVar4;
    do {
      Thread::Thread((Thread *)0x1067c3);
      local_50 = local_50 + 6;
    } while (local_50 != puVar4 + uVar2 * 6);
  }
  *(ulong **)(in_RDI + 8) = puVar4;
  std::function<void_()>::function((function<void_()> *)in_stack_ffffffffffffff80);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::deque
            ((deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)0x106810);
  MutexLock::MutexLock((MutexLock *)0x106825);
  Condition::Condition(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  return;
}

Assistant:

explicit ThreadPool(int size = 2) : 
                started(false),
                threadsize(size),
                threadlistptr(new Thread[size]),
                mutex(),
                cond(mutex)
            {}